

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
          (exhaustive_solver<baryonyx::itm::maximize_tag,double> *this,int k,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
          *reduced_cost,int r_size)

{
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *peVar1;
  item *piVar2;
  uint uVar3;
  ulong uVar4;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>_>
  _Var5;
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *peVar6;
  int *piVar7;
  long lVar8;
  uint *puVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  size_type __new_size;
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *peVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  
  peVar1 = this + 0x50;
  peVar6 = peVar1;
  for (peVar16 = *(exhaustive_solver<baryonyx::itm::maximize_tag,double> **)(this + 0x58);
      peVar16 != (exhaustive_solver<baryonyx::itm::maximize_tag,double> *)0x0;
      peVar16 = *(exhaustive_solver<baryonyx::itm::maximize_tag,double> **)
                 (peVar16 + (ulong)(*(int *)(peVar16 + 0x20) < k) * 8 + 0x10)) {
    if (k <= *(int *)(peVar16 + 0x20)) {
      peVar6 = peVar16;
    }
  }
  peVar16 = peVar1;
  if ((peVar6 != peVar1) && (peVar16 = peVar6, k < *(int *)(peVar6 + 0x20))) {
    peVar16 = peVar1;
  }
  if (peVar16 != peVar1) {
    __new_size = (size_type)r_size;
    std::
    vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>
    ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>
              *)this,__new_size);
    uVar4 = (ulong)(uint)r_size;
    if (r_size != 0) {
      lVar8 = *(long *)this;
      piVar7 = &((reduced_cost->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                ._M_head_impl)->f;
      lVar12 = 0;
      do {
        *(double *)(lVar8 + lVar12) = ((rc_data *)(piVar7 + -3))->value;
        *(int *)(lVar8 + 0xc + lVar12) = piVar7[-1];
        *(int *)(lVar8 + 8 + lVar12) = *piVar7;
        *(undefined4 *)(lVar8 + 0x10 + lVar12) = 0;
        piVar7 = piVar7 + 4;
        lVar12 = lVar12 + 0x18;
      } while (uVar4 * 0x18 != lVar12);
    }
    lVar8 = (long)*(int *)(peVar16 + 0x24);
    if (r_size == 0) {
      auVar17 = ZEXT1664(ZEXT816(0));
    }
    else {
      auVar17 = ZEXT1664(ZEXT816(0));
      lVar12 = 0;
      do {
        if (*(int *)(lVar8 * 4 + *(long *)(this + 0x18) + lVar12) != 0) {
          auVar17 = ZEXT864((ulong)(auVar17._0_8_ +
                                   *(double *)
                                    ((long)&((reduced_cost->_M_t).
                                             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                                            ._M_head_impl)->value + lVar12 * 4)));
        }
        lVar12 = lVar12 + 4;
      } while (uVar4 * 4 - lVar12 != 0);
    }
    iVar10 = 0;
    if ((ulong)*(uint *)(peVar16 + 0x28) != 1) {
      lVar12 = lVar8 * 4 + __new_size * 4 + *(long *)(this + 0x18);
      uVar11 = 0;
      uVar14 = 1;
      do {
        auVar19 = ZEXT864(0) << 0x40;
        auVar18 = auVar19._0_16_;
        if (r_size != 0) {
          lVar15 = 0;
          do {
            if (*(int *)(lVar12 + lVar15) != 0) {
              auVar19 = ZEXT864((ulong)(auVar19._0_8_ +
                                       *(double *)
                                        ((long)&((reduced_cost->_M_t).
                                                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                                                 .
                                                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                                                ._M_head_impl)->value + lVar15 * 4)));
            }
            auVar18 = auVar19._0_16_;
            lVar15 = lVar15 + 4;
          } while (uVar4 * 4 - lVar15 != 0);
        }
        if (auVar17._0_8_ < auVar18._0_8_) {
          uVar11 = uVar14 & 0xffffffff;
        }
        iVar10 = (int)uVar11;
        auVar18 = vmaxsd_avx(auVar18,auVar17._0_16_);
        auVar17 = ZEXT1664(auVar18);
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + __new_size * 4;
      } while (uVar14 != *(uint *)(peVar16 + 0x28));
    }
    if (r_size != 0) {
      lVar12 = *(long *)(this + 0x18);
      puVar9 = (uint *)(*(long *)this + 0x10);
      uVar11 = 0;
      do {
        *puVar9 = (uint)(*(int *)((iVar10 * r_size + lVar8) * 4 + lVar12 + uVar11 * 4) != 0);
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + 6;
      } while (uVar4 != uVar11);
    }
    lVar8 = *(long *)this;
    lVar12 = *(long *)(this + 8);
    if (lVar8 != lVar12) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (lVar8,lVar12,(int)LZCOUNT((lVar12 - lVar8 >> 3) * -0x5555555555555555) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (lVar8,lVar12);
    }
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>&,int)::_lambda(auto:1_const&)_1_>>
                      (*(undefined8 *)this,*(undefined8 *)(this + 8));
    lVar8 = *(long *)this;
    piVar2 = *(item **)(this + 8);
    lVar12 = (long)piVar2 - lVar8;
    if (lVar12 != 0) {
      lVar12 = (lVar12 >> 3) * -0x5555555555555555;
      piVar7 = (int *)(lVar8 + 0xc);
      piVar13 = &((reduced_cost->_M_t).
                  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                  .
                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                 ._M_head_impl)->f;
      do {
        ((rc_data *)(piVar13 + -3))->value = *(double *)(piVar7 + -3);
        piVar13[-1] = *piVar7;
        *piVar13 = piVar7[-1];
        piVar7 = piVar7 + 6;
        piVar13 = piVar13 + 4;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    if (_Var5._M_current == piVar2) {
      uVar3 = -(uint)(*(int *)(lVar8 + 0x10) == 0) | r_size;
    }
    else {
      uVar3 = (int)((ulong)((long)_Var5._M_current - lVar8) >> 3) * -0x55555555 - 1;
    }
    return uVar3;
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data[]>>>
            ();
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }